

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming(Aig_Man_t *p)

{
  void **ppvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  int *piVar6;
  Cnf_Dat_t *pCVar7;
  int **ppiVar8;
  int *piVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  
  iVar15 = p->nObjs[6] + p->nObjs[5];
  iVar13 = iVar15 * 7 + p->nObjs[3] * 5 + 1;
  iVar15 = iVar15 + p->nObjs[3];
  iVar12 = iVar15 * 3 + 1;
  pCVar7 = (Cnf_Dat_t *)malloc(0x48);
  pCVar7->pMan = (Aig_Man_t *)0x0;
  pCVar7->nVars = 0;
  pCVar7->nLiterals = 0;
  *(undefined8 *)&pCVar7->nClauses = 0;
  pCVar7->pClauses = (int **)0x0;
  pCVar7->pVarNums = (int *)0x0;
  pCVar7->pObj2Clause = (int *)0x0;
  pCVar7->pObj2Count = (int *)0x0;
  pCVar7->pClaPols = (uchar *)0x0;
  pCVar7->vMapping = (Vec_Int_t *)0x0;
  pCVar7->pMan = p;
  pCVar7->nLiterals = iVar13;
  pCVar7->nClauses = iVar12;
  ppiVar8 = (int **)malloc((long)(iVar15 * 3 + 2) << 3);
  pCVar7->pClauses = ppiVar8;
  lVar14 = (long)iVar13;
  piVar9 = (int *)malloc(lVar14 * 4);
  *ppiVar8 = piVar9;
  ppiVar8[iVar12] = piVar9 + lVar14;
  pVVar11 = p->vObjs;
  iVar13 = pVVar11->nSize;
  piVar9 = (int *)malloc((long)iVar13 * 4);
  pCVar7->pVarNums = piVar9;
  if (0 < (long)iVar13) {
    lVar10 = 0;
    do {
      piVar9[lVar10] = -1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar11->nSize);
  }
  pVVar3 = p->vCos;
  if (pVVar3->nSize < 1) {
    iVar13 = 1;
  }
  else {
    ppvVar4 = pVVar3->pArray;
    lVar10 = 0;
    do {
      ppvVar1 = ppvVar4 + lVar10;
      lVar10 = lVar10 + 1;
      piVar9[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar10;
    } while (lVar10 < pVVar3->nSize);
    iVar13 = (int)lVar10 + 1;
  }
  if (0 < pVVar11->nSize) {
    ppvVar4 = pVVar11->pArray;
    lVar10 = 0;
    do {
      pvVar5 = ppvVar4[lVar10];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
        piVar9[*(int *)((long)pvVar5 + 0x24)] = iVar13;
        iVar13 = iVar13 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar11->nSize);
  }
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    ppvVar4 = pVVar11->pArray;
    lVar10 = 0;
    do {
      piVar9[*(int *)((long)ppvVar4[lVar10] + 0x24)] = iVar13 + (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar11->nSize);
    iVar13 = iVar13 + (int)lVar10;
  }
  piVar9[p->pConst1->Id] = iVar13;
  pCVar7->nVars = iVar13 + 1;
  piVar9 = *ppiVar8;
  pVVar11 = p->vObjs;
  iVar13 = pVVar11->nSize;
  if (0 < iVar13) {
    lVar10 = 0;
    do {
      pvVar5 = pVVar11->pArray[lVar10];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
        piVar6 = pCVar7->pVarNums;
        iVar13 = piVar6[*(int *)((long)pvVar5 + 0x24)];
        iVar15 = piVar6[*(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24)];
        iVar2 = piVar6[*(int *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x24)];
        *ppiVar8 = piVar9;
        *piVar9 = iVar13 * 2;
        piVar9[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar15 * 2 ^ 1;
        piVar9[2] = (*(uint *)((long)pvVar5 + 0x10) & 1) + iVar2 * 2 ^ 1;
        ppiVar8[1] = piVar9 + 3;
        iVar13 = iVar13 * 2 + 1;
        piVar9[3] = iVar13;
        piVar9[4] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar15 * 2;
        ppiVar8[2] = piVar9 + 5;
        ppiVar8 = ppiVar8 + 3;
        piVar9[5] = iVar13;
        piVar9[6] = (*(uint *)((long)pvVar5 + 0x10) & 1) + iVar2 * 2;
        piVar9 = piVar9 + 7;
      }
      lVar10 = lVar10 + 1;
      pVVar11 = p->vObjs;
      iVar13 = pVVar11->nSize;
    } while (lVar10 < iVar13);
  }
  iVar15 = pCVar7->pVarNums[p->pConst1->Id];
  if (iVar15 <= iVar13) {
    *ppiVar8 = piVar9;
    ppiVar8 = ppiVar8 + 1;
    *piVar9 = iVar15 * 2;
    piVar9 = piVar9 + 1;
    pVVar11 = p->vCos;
    if (0 < pVVar11->nSize) {
      lVar10 = 0;
      do {
        pvVar5 = pVVar11->pArray[lVar10];
        iVar15 = pCVar7->pVarNums
                 [*(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24)];
        iVar13 = pCVar7->pVarNums[*(int *)((long)pvVar5 + 0x24)];
        *ppiVar8 = piVar9;
        *piVar9 = iVar13 * 2;
        piVar9[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar15 * 2 ^ 1;
        ppiVar8[1] = piVar9 + 2;
        iVar13 = iVar13 * 2 + 1;
        piVar9[2] = iVar13;
        piVar9[3] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar15 * 2;
        ppiVar8[2] = piVar9 + 4;
        ppiVar8 = ppiVar8 + 3;
        piVar9[4] = iVar13;
        piVar9 = piVar9 + 5;
        lVar10 = lVar10 + 1;
        pVVar11 = p->vCos;
      } while (lVar10 < pVVar11->nSize);
    }
    if ((long)piVar9 - (long)*pCVar7->pClauses >> 2 == lVar14) {
      if ((long)ppiVar8 - (long)pCVar7->pClauses >> 3 == (long)iVar12) {
        return pCVar7;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                    ,0x31c,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x31b,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                ,0x304,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + 5 * Aig_ManCoNum(p);
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + 3 * Aig_ManCoNum(p);

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    Aig_ManForEachCo( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        PoVar  = pCnf->pVarNums[ pObj->Id ];
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        // final clause (init-state is always 0 -> set the output to 0)
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}